

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::hugeint_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ArgMinMaxState<duckdb::hugeint_t,_int> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  hugeint_t *rdata_1;
  ArgMinMaxState<duckdb::hugeint_t,_int> **sdata_1;
  AggregateFinalizeData finalize_data;
  hugeint_t *rdata;
  ArgMinMaxState<duckdb::hugeint_t,_int> **sdata;
  hugeint_t *in_stack_ffffffffffffff78;
  ArgMinMaxState<duckdb::hugeint_t,_int> *in_stack_ffffffffffffff80;
  ArgMinMaxState<duckdb::hugeint_t,_int> *state;
  AggregateFinalizeData local_78;
  hugeint_t *local_60;
  ArgMinMaxState<duckdb::hugeint_t,_int> **local_58;
  AggregateFinalizeData local_50;
  hugeint_t *local_38;
  ArgMinMaxState<duckdb::hugeint_t,_int> **local_30;
  long local_28;
  ArgMinMaxState<duckdb::hugeint_t,_int> *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::ArgMinMaxState<duckdb::hugeint_t,int>*>
                         ((Vector *)0x8e66c0);
    local_38 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x8e66cf);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Finalize<duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x8e66ff
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::hugeint_t,int>*>
                         ((Vector *)0x8e671d);
    local_60 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x8e672c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (ArgMinMaxState<duckdb::hugeint_t,_int> *)0x0; state < local_20;
        state = (ArgMinMaxState<duckdb::hugeint_t,_int> *)
                &(state->super_ArgMinMaxStateBase).arg_null) {
      local_78.result_idx = (idx_t)(&(state->super_ArgMinMaxStateBase).is_initialized + local_28);
      ArgMinMaxBase<duckdb::GreaterThan,true>::
      Finalize<duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x8e6792);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}